

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O2

void Emb_ManComputeSolutions(Emb_Man_t *p,int nDims,int nSols)

{
  uint uVar1;
  Emb_Dat_t *pEVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  float *pfVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (p->pSols == (float *)0x0) {
    uVar1 = p->nObjs;
    pfVar3 = (float *)calloc((long)(int)(uVar1 * nSols),4);
    p->pSols = pfVar3;
    uVar4 = 0;
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    uVar6 = (ulong)(uint)nSols;
    if (nSols < 1) {
      uVar6 = uVar4;
    }
    uVar11 = (ulong)(uint)nDims;
    if (nDims < 1) {
      uVar11 = uVar4;
    }
    for (uVar7 = 0; uVar7 != uVar11; uVar7 = uVar7 + 1) {
      pEVar2 = p->pVecs;
      pfVar8 = pfVar3;
      for (uVar9 = 0; uVar9 != uVar6; uVar9 = uVar9 + 1) {
        for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
          pfVar8[uVar10] =
               *(float *)((long)pEVar2 + uVar10 * 4 + uVar4) * p->pEigen[uVar9][uVar7] +
               pfVar8[uVar10];
        }
        pfVar8 = pfVar8 + (int)uVar1;
      }
      uVar4 = uVar4 + (long)(int)uVar1 * 4;
    }
    return;
  }
  __assert_fail("p->pSols == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEmbed.c"
                ,0x57a,"void Emb_ManComputeSolutions(Emb_Man_t *, int, int)");
}

Assistant:

void Emb_ManComputeSolutions( Emb_Man_t * p, int nDims, int nSols )
{
    Emb_Dat_t * pX;
    float * pY;
    int i, j, k;
    assert( p->pSols == NULL );
    p->pSols = ABC_CALLOC( float, p->nObjs * nSols );
    for ( i = 0; i < nDims; i++ )
    {
        pX = Emb_ManVec( p, i );
        for ( j = 0; j < nSols; j++ )
        {
            pY = Emb_ManSol( p, j );
            for ( k = 0; k < p->nObjs; k++ )
                pY[k] += pX[k] * p->pEigen[j][i];
        }
    }
}